

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall
Clasp::ClaspFacade::SolveStrategy::detachAlgo
          (SolveStrategy *this,bool more,int nException,int state)

{
  __int_type signal;
  EventHandler *pEVar1;
  long *plVar2;
  char *pcVar3;
  string *unaff_R15;
  undefined1 auVar4 [12];
  Literal local_30 [2];
  Summary *local_28;
  
  if (nException == 1) {
    auVar4 = __cxa_rethrow();
    plVar2 = (long *)__cxa_begin_catch(auVar4._0_8_);
    if (auVar4._8_4_ == 2) {
      pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
      std::__cxx11::string::operator=(unaff_R15,pcVar3);
      __cxa_end_catch();
    }
    else {
      std::__cxx11::string::operator=(unaff_R15,"unknown error");
      __cxa_end_catch();
    }
    __cxa_end_catch();
  }
  else {
    switch(state) {
    case 0:
      if (nException == 0) {
        SolveAlgorithm::stop(this->algo_);
      }
      else {
        SolveAlgorithm::stop(this->algo_);
      }
    case 1:
      signal = (this->signal_).super___atomic_base<unsigned_int>._M_i;
      if (nException == 0) {
        stopStep(this->facade_,signal,!more);
      }
      else {
        stopStep(this->facade_,signal,!more);
      }
    case 2:
      pEVar1 = this->handler_;
      if (pEVar1 != (EventHandler *)0x0) {
        if (nException == 0) {
          local_28 = &this->facade_->step_;
          local_30[0].rep_ =
               (Event_t<Clasp::ClaspFacade::StepReady>::id_s & 0xffff) << 0xc |
               local_30[0].rep_ & 0xf0000000;
          (*(pEVar1->super_ModelHandler)._vptr_ModelHandler[4])();
        }
        else {
          local_28 = &this->facade_->step_;
          local_30[0].rep_ =
               (Event_t<Clasp::ClaspFacade::StepReady>::id_s & 0xffff) << 0xc |
               local_30[0].rep_ & 0xf0000000;
          (*(pEVar1->super_ModelHandler)._vptr_ModelHandler[4])();
        }
      }
    case 3:
      this->result_ = (this->facade_->step_).result;
      local_30[0].rep_ = 0;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::resize
                (&this->facade_->assume_,this->aTop_,local_30);
      (*this->_vptr_SolveStrategy[4])(this,3);
    }
  }
  return;
}

Assistant:

void ClaspFacade::SolveStrategy::detachAlgo(bool more, int nException, int state) {
#define PROTECT(ec, X) if ((ec)) try { X; } catch (...) {} else X
	try {
		if (nException == 1) { throw; }
		switch (state) {
			case 0: ++state; PROTECT(nException, algo_->stop());  // FALLTHROUGH
			case 1: ++state; PROTECT(nException, facade_->stopStep(signal_, !more));  // FALLTHROUGH
			case 2: ++state; if (handler_) { PROTECT(nException, handler_->onEvent(StepReady(facade_->summary()))); }   // FALLTHROUGH
			case 3: state = -1;
				result_ = facade_->result();
				facade_->assume_.resize(aTop_);
				doNotify(event_detach);
			default:	break;
		}
	}
	catch (...) {
		error_ = "Operation failed: ";
		if (!signal_)    { signal_ = SIGERROR; }
		if (state != -1) { detachAlgo(more, 2, state); }
		if ((mode_ & SolveMode_t::Async) == 0) {
			error_ += "exception thrown";
			throw;
		}
		try { throw; }
		catch (const std::exception& e) { error_ = e.what(); }
		catch (...)                     { error_ = "unknown error"; }
	}
}